

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O3

void dumpNodeToDot(PSNode *node,PTType type)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong uVar3;
  PSNode *node_00;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  undefined8 *puVar11;
  char *__format;
  long *plVar12;
  const_iterator __begin1;
  const_iterator local_48;
  
  uVar7 = 0;
  printf("\tNODE%u [label=\"<%u> ",(ulong)*(uint *)(node + 8));
  printPSNodeType(*(PSNodeType *)(node + 0x90));
  printf("\\n");
  printName(node,true);
  if (*(uint **)(node + 0xa0) != (uint *)0x0) {
    uVar7 = **(uint **)(node + 0xa0);
  }
  printf("\\nparent: %u\\n",(ulong)uVar7);
  if ((*(int *)(node + 0x90) == 1) &&
     (((*(long *)(node + 0x88) != 0 || (((byte)node[0xe9] & 1) != 0)) || (node[0xe8] == (PSNode)0x1)
      ))) {
    printf("\\n[size: %zu, heap: %u, zeroed: %u]");
  }
  if (verbose[0x80] == 1) {
    iVar6 = *(int *)(node + 0x90);
    if (iVar6 == 0xb) {
      printf("called from: [");
      plVar1 = *(long **)(node + 0x110);
      for (plVar12 = *(long **)(node + 0x108); plVar12 != plVar1; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
      iVar6 = *(int *)(node + 0x90);
    }
    if (iVar6 == 10) {
      printf("returns from: [");
      plVar1 = *(long **)(node + 0xf0);
      for (plVar12 = *(long **)(node + 0xe8); plVar12 != plVar1; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
      iVar6 = *(int *)(node + 0x90);
    }
    if (iVar6 == 0xc) {
      printf("returns to: [");
      plVar1 = *(long **)(node + 0xf0);
      for (plVar12 = *(long **)(node + 0xe8); plVar12 != plVar1; plVar12 = plVar12 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar12 + 8));
      }
      printf("]\\n");
    }
  }
  if ((verbose[0x80] == 1) && (*(long *)(node + 0x60) != *(long *)(node + 0x58))) {
    printf("\\n--- operands ---\\n");
    puVar2 = *(undefined8 **)(node + 0x60);
    for (puVar11 = *(undefined8 **)(node + 0x58); puVar11 != puVar2; puVar11 = puVar11 + 1) {
      printName((PSNode *)*puVar11,true);
    }
    printf("\\n------\\n");
  }
  if (((verbose[0x80] & 1) != 0) && (*(long *)(node + 200) != 0)) {
    printf("\\n--- points-to set ---\\n");
  }
  lVar5 = dg::Offset::UNKNOWN;
  local_48.container_it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)(node + 0xc0);
  local_48.container_end.
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)(__node_type *)0x0
  ;
  local_48.pos = 0;
  if (*(long *)(node + 200) != 0) {
    uVar3 = *(ulong *)((long)&(((__node_type *)
                               local_48.container_it.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                               ._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    local_48.pos = 0;
    uVar4 = uVar3 & 1;
    while (uVar4 == 0) {
      if (local_48.pos == 0x3f) {
        local_48.pos = 0x40;
        break;
      }
      bVar9 = (byte)local_48.pos;
      local_48.pos = local_48.pos + 1;
      uVar4 = uVar3 >> (bVar9 & 0x3f) & 2;
    }
  }
  if (local_48.pos != 0 ||
      local_48.container_it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    do {
      lVar10 = local_48.pos * 0x10 + __M_assign;
      lVar8 = *(long *)((long)local_48.container_it.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ._M_cur + 8) * 0x10;
      node_00 = *(PSNode **)(lVar8 + -0x10 + lVar10);
      lVar8 = *(long *)(lVar8 + -8 + lVar10);
      printf("\\n    -> ");
      printName(node_00,true);
      printf(" + ");
      if (lVar8 == lVar5) {
        printf("Offset::UNKNOWN");
      }
      else {
        printf("%lu",lVar8);
      }
      dg::ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++(&local_48);
    } while (local_48.container_it.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
             != (__node_type *)0x0 || local_48.pos != 0);
  }
  if (verbose[0x80] != 0) {
    dumpPointerGraphData(node,type,true);
  }
  printf("\", shape=box");
  if (*(int *)(node + 0x90) == 3) {
    __format = ", style=filled, fillcolor=orange";
  }
  else {
    if (((*(long *)(node + 200) != 0) || (uVar7 = *(int *)(node + 0x90) - 2, 4 < uVar7)) ||
       ((0x1dU >> (uVar7 & 0x1f) & 1) == 0)) goto LAB_00112e5b;
    __format = ", style=filled, fillcolor=red";
  }
  printf(__format);
LAB_00112e5b:
  puts("]");
  return;
}

Assistant:

static void dumpNodeToDot(PSNode *node, PTType type) {
    printf("\tNODE%u [label=\"<%u> ", node->getID(), node->getID());
    printPSNodeType(node->getType());
    printf("\\n");
    printName(node, true);
    printf("\\nparent: %u\\n",
           node->getParent() ? node->getParent()->getID() : 0);

    PSNodeAlloc *alloc = PSNodeAlloc::get(node);
    if (alloc &&
        (alloc->getSize() || alloc->isHeap() || alloc->isZeroInitialized()))
        printf("\\n[size: %zu, heap: %u, zeroed: %u]", alloc->getSize(),
               alloc->isHeap(), alloc->isZeroInitialized());
    if (verbose) {
        if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
            printf("called from: [");
            for (auto *r : entry->getCallers())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeCallRet *CR = PSNodeCallRet::get(node)) {
            printf("returns from: [");
            for (auto *r : CR->getReturns())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeRet *R = PSNodeRet::get(node)) {
            printf("returns to: [");
            for (auto *r : R->getReturnSites())
                printf("%u ", r->getID());
            printf("]\\n");
        }
    }

    if (verbose && node->getOperandsNum() > 0) {
        printf("\\n--- operands ---\\n");
        for (PSNode *op : node->getOperands()) {
            printName(op, true);
        }
        printf("\\n------\\n");
    }

    if (verbose && !node->pointsTo.empty()) {
        printf("\\n--- points-to set ---\\n");
    }

    for (const Pointer &ptr : node->pointsTo) {
        printf("\\n    -> ");
        printName(ptr.target, true);
        printf(" + ");
        if (ptr.offset.isUnknown())
            printf("Offset::UNKNOWN");
        else
            printf("%" PRIu64, *ptr.offset);
    }

    if (verbose) {
        dumpPointerGraphData(node, type, true /* dot */);
    }

    printf("\", shape=box");
    if (node->getType() != PSNodeType::STORE) {
        if (node->pointsTo.empty() && (node->getType() == PSNodeType::LOAD ||
                                       node->getType() == PSNodeType::GEP ||
                                       node->getType() == PSNodeType::CAST ||
                                       node->getType() == PSNodeType::PHI))
            printf(", style=filled, fillcolor=red");
    } else {
        printf(", style=filled, fillcolor=orange");
    }

    printf("]\n");
}